

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<Fad<Fad<double>_>_>::Resize(TPZVec<Fad<Fad<double>_>_> *this,int64_t newsize)

{
  long lVar1;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  Fad<Fad<double>_> *pFVar5;
  ostream *this_00;
  void *this_01;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong in_RSI;
  long in_RDI;
  ulong uVar9;
  int64_t i;
  int64_t large;
  Fad<Fad<double>_> *newstore;
  Fad<Fad<double>_> *in_stack_ffffffffffffff18;
  Fad<Fad<double>_> *in_stack_ffffffffffffff20;
  Fad<Fad<double>_> *local_c8;
  Fad<Fad<double>_> *in_stack_ffffffffffffff40;
  Fad<Fad<double>_> *pFVar10;
  ulong local_a8;
  ulong *local_90;
  long local_38;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar1 = *(long *)(in_RDI + 8);
      if (lVar1 != 0) {
        lVar2 = *(long *)(lVar1 + -8);
        for (lVar6 = lVar1 + lVar2 * 0x58; lVar1 != lVar6; lVar6 = lVar6 + -0x58) {
          Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffff20);
        }
        operator_delete__((void *)(lVar1 + -8),lVar2 * 0x58 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = in_RSI;
      uVar7 = SUB168(auVar4 * ZEXT816(0x58),0);
      uVar9 = uVar7 + 8;
      if (SUB168(auVar4 * ZEXT816(0x58),8) != 0 || 0xfffffffffffffff7 < uVar7) {
        uVar9 = 0xffffffffffffffff;
      }
      puVar8 = (ulong *)operator_new__(uVar9);
      *puVar8 = in_RSI;
      puVar8 = puVar8 + 1;
      if (in_RSI != 0) {
        local_90 = puVar8;
        do {
          Fad<Fad<double>_>::Fad(in_stack_ffffffffffffff40);
          local_90 = local_90 + 0xb;
        } while (local_90 != puVar8 + in_RSI * 0xb);
      }
      local_a8 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_a8 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_38 = 0; local_38 < (long)local_a8; local_38 = local_38 + 1) {
        Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      if ((*(long *)(in_RDI + 8) != 0) &&
         (pFVar10 = *(Fad<Fad<double>_> **)(in_RDI + 8), pFVar10 != (Fad<Fad<double>_> *)0x0)) {
        pFVar5 = pFVar10 + -1;
        dVar3 = pFVar10[-1].defaultVal.defaultVal;
        local_c8 = pFVar10 + (long)dVar3;
        if (pFVar10 != local_c8) {
          do {
            local_c8 = local_c8 + -1;
            Fad<Fad<double>_>::~Fad(local_c8);
          } while (local_c8 != pFVar10);
        }
        operator_delete__(&(pFVar5->defaultVal).defaultVal,(long)dVar3 * 0x58 + 8);
      }
      *(ulong **)(in_RDI + 8) = puVar8;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}